

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Decref(Regexp *this)

{
  int iVar1;
  mapped_type *pmVar2;
  map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
  *in_RDI;
  int r;
  MutexLock l;
  Regexp *in_stack_00000180;
  Mutex *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  key_type *in_stack_ffffffffffffffd8;
  map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
  *this_00;
  undefined2 local_14;
  
  if (*(short *)&(in_RDI->_M_t)._M_impl.field_0x4 == -1) {
    MutexLock::MutexLock
              ((MutexLock *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    this_00 = in_RDI;
    pmVar2 = std::
             map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
             ::operator[](in_RDI,in_stack_ffffffffffffffd8);
    iVar1 = *pmVar2 + -1;
    if (iVar1 < 0xffff) {
      local_14 = (undefined2)iVar1;
      *(undefined2 *)&(in_RDI->_M_t)._M_impl.field_0x4 = local_14;
      std::
      map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
      ::erase((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (key_type *)in_stack_ffffffffffffff98);
    }
    else {
      pmVar2 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](this_00,in_stack_ffffffffffffffd8);
      *pmVar2 = iVar1;
    }
    MutexLock::~MutexLock((MutexLock *)0x2239de);
  }
  else {
    *(short *)&(in_RDI->_M_t)._M_impl.field_0x4 = *(short *)&(in_RDI->_M_t)._M_impl.field_0x4 + -1;
    if (*(short *)&(in_RDI->_M_t)._M_impl.field_0x4 == 0) {
      Destroy(in_stack_00000180);
    }
  }
  return;
}

Assistant:

void Regexp::Decref() {
  if (ref_ == kMaxRef) {
    // Ref count is stored in overflow map.
    MutexLock l(ref_mutex);
    int r = (*ref_map)[this] - 1;
    if (r < kMaxRef) {
      ref_ = static_cast<uint16_t>(r);
      ref_map->erase(this);
    } else {
      (*ref_map)[this] = r;
    }
    return;
  }
  ref_--;
  if (ref_ == 0)
    Destroy();
}